

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

float __thiscall
duckdb::Interpolator<false>::Extract<float,float>
          (Interpolator<false> *this,float *dest,Vector *result)

{
  float *in_RDX;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float hi;
  float lo;
  Vector *in_stack_ffffffffffffffc8;
  float local_4;
  
  if (*(long *)(in_RDI + 6) == *(long *)(in_RDI + 4)) {
    local_4 = CastInterpolation::Cast<float,float>(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    fVar1 = CastInterpolation::Cast<float,float>(in_RDI,in_stack_ffffffffffffffc8);
    fVar2 = CastInterpolation::Cast<float,float>(in_RDI,in_stack_ffffffffffffffc8);
    local_4 = CastInterpolation::Interpolate<float>(in_RDX,(double)CONCAT44(fVar1,fVar2),in_RDI);
  }
  return local_4;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}